

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlDOMWrapCtxtPtr_conflict xmlDOMWrapNewCtxt(void)

{
  xmlDOMWrapCtxtPtr_conflict ret;
  
  ret = (xmlDOMWrapCtxtPtr_conflict)(*xmlMalloc)(0x20);
  if (ret == (xmlDOMWrapCtxtPtr_conflict)0x0) {
    xmlTreeErrMemory("allocating DOM-wrapper context");
    ret = (xmlDOMWrapCtxtPtr_conflict)0x0;
  }
  else {
    memset(ret,0,0x20);
  }
  return ret;
}

Assistant:

xmlDOMWrapCtxtPtr
xmlDOMWrapNewCtxt(void)
{
    xmlDOMWrapCtxtPtr ret;

    ret = xmlMalloc(sizeof(xmlDOMWrapCtxt));
    if (ret == NULL) {
	xmlTreeErrMemory("allocating DOM-wrapper context");
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlDOMWrapCtxt));
    return (ret);
}